

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

bool deqp::gls::anon_unknown_1::outputTypeIsFloatType(OutputType type)

{
  undefined1 local_9;
  OutputType type_local;
  
  if ((((type == OUTPUTTYPE_FLOAT) || (type == OUTPUTTYPE_VEC2)) || (type == OUTPUTTYPE_VEC3)) ||
     (type == OUTPUTTYPE_VEC4)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool outputTypeIsFloatType (DrawTestSpec::OutputType type)
{
	if (type == DrawTestSpec::OUTPUTTYPE_FLOAT
		|| type == DrawTestSpec::OUTPUTTYPE_VEC2
		|| type == DrawTestSpec::OUTPUTTYPE_VEC3
		|| type == DrawTestSpec::OUTPUTTYPE_VEC4)
		return true;

	return false;
}